

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ColorButton(char *desc_id,ImVec4 *col,ImGuiColorEditFlags flags,ImVec2 size)

{
  ImDrawList *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 IVar4;
  ImGuiWindow *this;
  float fVar5;
  float *local_138;
  float local_114;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  undefined1 local_d8 [8];
  ImVec4 col_source;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_ac;
  float local_a4;
  float local_a0;
  float mid_x;
  float off;
  ImRect bb_inner;
  float rounding;
  float grid_step;
  ImVec4 col_rgb_without_alpha;
  ImVec4 col_rgb;
  bool pressed;
  bool held;
  bool hovered;
  undefined1 local_58 [8];
  ImRect bb;
  float default_size;
  ImGuiID id;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiColorEditFlags flags_local;
  ImVec4 *col_local;
  char *desc_id_local;
  float fStack_10;
  ImVec2 size_local;
  
  unique0x100005ff = size;
  this = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((this->SkipItems & 1U) == 0) {
    bb.Max.y = (float)ImGuiWindow::GetID(this,desc_id,(char *)0x0);
    bb.Max.x = GetFrameHeight();
    if ((desc_id_local._4_4_ == 0.0) && (!NAN(desc_id_local._4_4_))) {
      desc_id_local._4_4_ = bb.Max.x;
    }
    if ((fStack_10 == 0.0) && (!NAN(fStack_10))) {
      fStack_10 = bb.Max.x;
    }
    register0x00001200 = operator+(&(this->DC).CursorPos,(ImVec2 *)((long)&desc_id_local + 4));
    ImRect::ImRect((ImRect *)local_58,&(this->DC).CursorPos,(ImVec2 *)&col_rgb.w);
    if (fStack_10 < bb.Max.x) {
      local_114 = 0.0;
    }
    else {
      local_114 = (pIVar2->Style).FramePadding.y;
    }
    ItemSize((ImRect *)local_58,local_114);
    bVar3 = ItemAdd((ImRect *)local_58,(ImGuiID)bb.Max.y,(ImRect *)0x0);
    if (bVar3) {
      col_rgb.z._1_1_ =
           ButtonBehavior((ImRect *)local_58,(ImGuiID)bb.Max.y,(bool *)((long)&col_rgb.z + 3),
                          (bool *)((long)&col_rgb.z + 2),0);
      window._4_4_ = flags;
      if ((flags & 2U) != 0) {
        window._4_4_ = flags & 0xfff9ffff;
      }
      col_rgb_without_alpha.z = col->x;
      col_rgb_without_alpha.w = col->y;
      col_rgb.x = col->z;
      col_rgb.y = col->w;
      if ((window._4_4_ & 0x10000000) != 0) {
        ColorConvertHSVtoRGB
                  (col_rgb_without_alpha.z,col_rgb_without_alpha.w,col_rgb.x,
                   &col_rgb_without_alpha.z,&col_rgb_without_alpha.w,&col_rgb.x);
      }
      ImVec4::ImVec4((ImVec4 *)&rounding,col_rgb_without_alpha.z,col_rgb_without_alpha.w,col_rgb.x,
                     1.0);
      fVar5 = ImMin<float>(desc_id_local._4_4_,fStack_10);
      bb_inner.Max.y = fVar5 / 2.99;
      bb_inner.Max.x = ImMin<float>((pIVar2->Style).FrameRounding,bb_inner.Max.y * 0.5);
      mid_x = (float)local_58._0_4_;
      off = (float)local_58._4_4_;
      bb_inner.Min = bb.Min;
      local_a0 = -0.75;
      ImRect::Expand((ImRect *)&mid_x,-0.75);
      if (((window._4_4_ & 0x40000) == 0) || (1.0 <= col_rgb.y)) {
        if ((window._4_4_ & 0x20000) == 0) {
          local_138 = &rounding;
        }
        else {
          local_138 = &col_rgb_without_alpha.z;
        }
        local_d8._0_4_ = local_138[0];
        local_d8._4_4_ = local_138[1];
        col_source._0_8_ = *(undefined8 *)(local_138 + 2);
        if (1.0 <= col_source.y) {
          pIVar1 = this->DrawList;
          IVar4 = GetColorU32((ImVec4 *)local_d8);
          ImDrawList::AddRectFilled(pIVar1,(ImVec2 *)&mid_x,&bb_inner.Min,IVar4,bb_inner.Max.x,0xf);
        }
        else {
          local_e0 = _mid_x;
          local_e8 = bb_inner.Min;
          IVar4 = GetColorU32((ImVec4 *)local_d8);
          fVar5 = bb_inner.Max.y;
          ImVec2::ImVec2(&local_f0,local_a0,local_a0);
          RenderColorRectWithAlphaCheckerboard
                    (local_e0,local_e8,IVar4,fVar5,local_f0,bb_inner.Max.x,-1);
        }
      }
      else {
        local_a4 = (float)(int)((mid_x + bb_inner.Min.x) * 0.5 + 0.5);
        ImVec2::ImVec2(&local_ac,mid_x + bb_inner.Max.y,off);
        local_b8 = bb_inner.Min;
        IVar4 = GetColorU32((ImVec4 *)&col_rgb_without_alpha.z);
        fVar5 = bb_inner.Max.y;
        ImVec2::ImVec2(&local_c0,local_a0 - bb_inner.Max.y,local_a0);
        RenderColorRectWithAlphaCheckerboard
                  (local_ac,local_b8,IVar4,fVar5,local_c0,bb_inner.Max.x,10);
        pIVar1 = this->DrawList;
        ImVec2::ImVec2((ImVec2 *)&col_source.z,local_a4,bb_inner.Min.y);
        IVar4 = GetColorU32((ImVec4 *)&rounding);
        ImDrawList::AddRectFilled
                  (pIVar1,(ImVec2 *)&mid_x,(ImVec2 *)&col_source.z,IVar4,bb_inner.Max.x,5);
      }
      RenderNavHighlight((ImRect *)local_58,(ImGuiID)bb.Max.y,1);
      if ((pIVar2->Style).FrameBorderSize <= 0.0) {
        pIVar1 = this->DrawList;
        IVar4 = GetColorU32(7,1.0);
        ImDrawList::AddRect(pIVar1,(ImVec2 *)local_58,&bb.Min,IVar4,bb_inner.Max.x,0xf,1.0);
      }
      else {
        local_f8.x = (float)local_58._0_4_;
        local_f8.y = (float)local_58._4_4_;
        local_100 = bb.Min;
        RenderFrameBorder((ImVec2)local_58,bb.Min,bb_inner.Max.x);
      }
      if ((((float)pIVar2->ActiveId == bb.Max.y) && ((window._4_4_ & 0x200) == 0)) &&
         (bVar3 = BeginDragDropSource(0), bVar3)) {
        if ((window._4_4_ & 2) == 0) {
          SetDragDropPayload("_COL4F",&col_rgb_without_alpha.z,0x10,2);
        }
        else {
          SetDragDropPayload("_COL3F",&col_rgb_without_alpha.z,0xc,2);
        }
        ImVec2::ImVec2(&local_108,0.0,0.0);
        ColorButton(desc_id,col,window._4_4_,local_108);
        SameLine(0.0,-1.0);
        TextEx("Color",(char *)0x0,0);
        EndDragDropSource();
      }
      if (((window._4_4_ & 0x40) == 0) && ((col_rgb.z._3_1_ & 1) != 0)) {
        ColorTooltip(desc_id,&col->x,window._4_4_ & 0x18060002);
      }
      size_local.x._3_1_ = (bool)(col_rgb.z._1_1_ & 1);
    }
    else {
      size_local.x._3_1_ = false;
    }
  }
  else {
    size_local.x._3_1_ = false;
  }
  return size_local.x._3_1_;
}

Assistant:

bool ImGui::ColorButton(const char* desc_id, const ImVec4& col, ImGuiColorEditFlags flags, ImVec2 size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(desc_id);
    float default_size = GetFrameHeight();
    if (size.x == 0.0f)
        size.x = default_size;
    if (size.y == 0.0f)
        size.y = default_size;
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(bb, (size.y >= default_size) ? g.Style.FramePadding.y : 0.0f);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    if (flags & ImGuiColorEditFlags_NoAlpha)
        flags &= ~(ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf);

    ImVec4 col_rgb = col;
    if (flags & ImGuiColorEditFlags_InputHSV)
        ColorConvertHSVtoRGB(col_rgb.x, col_rgb.y, col_rgb.z, col_rgb.x, col_rgb.y, col_rgb.z);

    ImVec4 col_rgb_without_alpha(col_rgb.x, col_rgb.y, col_rgb.z, 1.0f);
    float grid_step = ImMin(size.x, size.y) / 2.99f;
    float rounding = ImMin(g.Style.FrameRounding, grid_step * 0.5f);
    ImRect bb_inner = bb;
    float off = -0.75f; // The border (using Col_FrameBg) tends to look off when color is near-opaque and rounding is enabled. This offset seemed like a good middle ground to reduce those artifacts.
    bb_inner.Expand(off);
    if ((flags & ImGuiColorEditFlags_AlphaPreviewHalf) && col_rgb.w < 1.0f)
    {
        float mid_x = (float)(int)((bb_inner.Min.x + bb_inner.Max.x) * 0.5f + 0.5f);
        RenderColorRectWithAlphaCheckerboard(ImVec2(bb_inner.Min.x + grid_step, bb_inner.Min.y), bb_inner.Max, GetColorU32(col_rgb), grid_step, ImVec2(-grid_step + off, off), rounding, ImDrawCornerFlags_TopRight| ImDrawCornerFlags_BotRight);
        window->DrawList->AddRectFilled(bb_inner.Min, ImVec2(mid_x, bb_inner.Max.y), GetColorU32(col_rgb_without_alpha), rounding, ImDrawCornerFlags_TopLeft|ImDrawCornerFlags_BotLeft);
    }
    else
    {
        // Because GetColorU32() multiplies by the global style Alpha and we don't want to display a checkerboard if the source code had no alpha
        ImVec4 col_source = (flags & ImGuiColorEditFlags_AlphaPreview) ? col_rgb : col_rgb_without_alpha;
        if (col_source.w < 1.0f)
            RenderColorRectWithAlphaCheckerboard(bb_inner.Min, bb_inner.Max, GetColorU32(col_source), grid_step, ImVec2(off, off), rounding);
        else
            window->DrawList->AddRectFilled(bb_inner.Min, bb_inner.Max, GetColorU32(col_source), rounding, ImDrawCornerFlags_All);
    }
    RenderNavHighlight(bb, id);
    if (g.Style.FrameBorderSize > 0.0f)
        RenderFrameBorder(bb.Min, bb.Max, rounding);
    else
        window->DrawList->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_FrameBg), rounding); // Color button are often in need of some sort of border

    // Drag and Drop Source
    // NB: The ActiveId test is merely an optional micro-optimization, BeginDragDropSource() does the same test.
    if (g.ActiveId == id && !(flags & ImGuiColorEditFlags_NoDragDrop) && BeginDragDropSource())
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            SetDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_3F, &col_rgb, sizeof(float) * 3, ImGuiCond_Once);
        else
            SetDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_4F, &col_rgb, sizeof(float) * 4, ImGuiCond_Once);
        ColorButton(desc_id, col, flags);
        SameLine();
        TextEx("Color");
        EndDragDropSource();
    }

    // Tooltip
    if (!(flags & ImGuiColorEditFlags_NoTooltip) && hovered)
        ColorTooltip(desc_id, &col.x, flags & (ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf));

    return pressed;
}